

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5Fts5Func(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)sqlite3_value_pointer(*apArg,"fts5_api_ptr");
  if (puVar1 != (undefined8 *)0x0) {
    *puVar1 = pCtx->pFunc->pUserData;
  }
  return;
}

Assistant:

static void fts5Fts5Func(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apArg           /* Function arguments */
){
  Fts5Global *pGlobal = (Fts5Global*)sqlite3_user_data(pCtx);
  fts5_api **ppApi;
  UNUSED_PARAM(nArg);
  assert( nArg==1 );
  ppApi = (fts5_api**)sqlite3_value_pointer(apArg[0], "fts5_api_ptr");
  if( ppApi ) *ppApi = &pGlobal->api;
}